

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  QStyle *pQVar3;
  Style *this;
  QString local_200;
  QString local_1e8;
  undefined1 local_1d0 [8];
  MainWindow w;
  QString style;
  Style *style_;
  QStyle *local_110;
  QStyle *fusion;
  QStringList keys;
  Settings settings;
  QString local_40;
  QApplication local_28 [8];
  QApplication a;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  argv_local._0_4_ = argc;
  qRegisterMetaType<RegExp>();
  qRegisterMetaType<RegExpPath>();
  qRegisterMetaType<RegExpReplacement>();
  qRegisterMetaType<SearchParams>();
  qRegisterMetaType<ReplaceParams>();
  qRegisterMetaType<SearchHits>();
  qRegisterMetaType<CountFilesParams>();
  qRegisterMetaType<GetListingParams>();
  qRegisterMetaType<ReplacedParams>();
  qRegisterMetaType<RenameParams>();
  qRegisterMetaType<SearchNameHits>();
  QApplication::QApplication(local_28,(int *)&argv_local,argv,0x60204);
  QString::QString(&local_40,"mugi-grep");
  QCoreApplication::setApplicationName(&local_40);
  QString::~QString(&local_40);
  QString::QString((QString *)&settings.mStyle.d.size,"1.6.0");
  QCoreApplication::setApplicationVersion((QString *)&settings.mStyle.d.size);
  QString::~QString((QString *)&settings.mStyle.d.size);
  Settings::Settings((Settings *)&keys.d.size);
  QStyleFactory::keys();
  QString::QString((QString *)&style_,"Fusion");
  pQVar3 = (QStyle *)QStyleFactory::create((QString *)&style_);
  QString::~QString((QString *)&style_);
  local_110 = pQVar3;
  this = (Style *)operator_new(0x18);
  Style::Style(this,local_110);
  QCoreApplication::instance();
  QApplication::setStyle((QStyle *)this);
  Settings::style((QString *)&w.mViewOptionAll,(Settings *)&keys.d.size);
  bVar1 = QString::operator==((QString *)&w.mViewOptionAll,"dark");
  if (bVar1) {
    StyleHelper::setDarkStyle();
  }
  else {
    StyleHelper::setLightStyle();
  }
  MainWindow::MainWindow((MainWindow *)local_1d0,(Settings *)&keys.d.size,(QWidget *)0x0);
  QWidget::show();
  QCoreApplication::applicationDirPath();
  QString::QString(&local_200,"debug");
  bVar2 = QString::endsWith(&local_1e8,(CaseSensitivity)&local_200);
  QString::~QString(&local_200);
  QString::~QString(&local_1e8);
  if ((bVar2 & 1) != 0) {
    LineContext::testParseCpp();
    LineContext::testParsePy();
  }
  argv_local._4_4_ = QApplication::exec();
  MainWindow::~MainWindow((MainWindow *)local_1d0);
  QString::~QString((QString *)&w.mViewOptionAll);
  QList<QString>::~QList((QList<QString> *)&fusion);
  Settings::~Settings((Settings *)&keys.d.size);
  QApplication::~QApplication(local_28);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    //QTextCodec::setCodecForCStrings(QTextCodec::codecForName("UTF-8"));

    qRegisterMetaType<RegExp>();
    qRegisterMetaType<RegExpPath>();
    qRegisterMetaType<RegExpReplacement>();
    qRegisterMetaType<SearchParams>();
    qRegisterMetaType<ReplaceParams>();
    qRegisterMetaType<SearchHits>();
    qRegisterMetaType<CountFilesParams>();
    qRegisterMetaType<GetListingParams>();
    qRegisterMetaType<ReplacedParams>();
    qRegisterMetaType<RenameParams>();
    qRegisterMetaType<SearchNameHits>();

    QApplication a(argc, argv);
    a.setApplicationName(APP_NAME);
    a.setApplicationVersion(VERSION);

    Settings settings;

    QStringList keys = QStyleFactory::keys();

    QStyle* fusion = QStyleFactory::create("Fusion");
    Style* style_ = new Style(fusion);

    qApp->setStyle(style_);

    QString style = settings.style();
    if (style == "dark") {
        StyleHelper::setDarkStyle();
    } else {
        StyleHelper::setLightStyle();
    }

    //
    /*a.setStyle("Windows");
    QStringList keys = QStyleFactory::keys();
    qDebug() << keys[0];*/
    //RegExpPath::test();
    //RegExp::test();
    //SearchResultRenderer::testDoZebra();

    MainWindow w(&settings);
    w.show();

    if (a.applicationDirPath().endsWith("debug")) {
        LineContext::testParseCpp();
        LineContext::testParsePy();
    }

    //SearchCache::testTokenize();

    return a.exec();
}